

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall Address_EmptyAddressTest_Test::TestBody(Address_EmptyAddressTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_3a0;
  Message local_398 [2];
  CfdException *anon_var_0;
  string local_380 [32];
  Address local_360 [383];
  byte local_1e1;
  char *pcStack_1e0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_1d0 [3];
  string local_1b8 [32];
  undefined1 local_198 [8];
  AssertionResult gtest_ar;
  Address empty_address;
  Address_EmptyAddressTest_Test *this_local;
  
  cfd::core::Address::Address((Address *)&gtest_ar.message_);
  cfd::core::Address::GetAddress_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_198,"\"\"","empty_address.GetAddress().c_str()","",pcVar2);
  std::__cxx11::string::~string(local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe20,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe20);
  if (bVar1) {
    local_1e1 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_380,"",(allocator *)((long)&anon_var_0 + 7));
      cfd::core::Address::Address(local_360,local_380);
      cfd::core::Address::operator=((Address *)&gtest_ar.message_,local_360);
      cfd::core::Address::~Address(local_360);
      std::__cxx11::string::~string(local_380);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
    }
    if ((local_1e1 & 1) != 0) goto LAB_00370836;
    pcStack_1e0 = 
    "Expected: (empty_address = Address(\"\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_398);
  testing::internal::AssertHelper::AssertHelper
            (&local_3a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
             ,0x2d,pcStack_1e0);
  testing::internal::AssertHelper::operator=(&local_3a0,local_398);
  testing::internal::AssertHelper::~AssertHelper(&local_3a0);
  testing::Message::~Message(local_398);
LAB_00370836:
  cfd::core::Address::~Address((Address *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Address, EmptyAddressTest) {
  Address empty_address;
  EXPECT_STREQ("", empty_address.GetAddress().c_str());

  EXPECT_THROW((empty_address = Address("")), CfdException);
}